

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

void __thiscall duckdb::QueryProfiler::WriteToFile(QueryProfiler *this,char *path,string *info)

{
  IOException *this_00;
  int *piVar1;
  char *pcVar2;
  ofstream out;
  allocator local_239;
  string local_238;
  long local_218;
  filebuf local_210 [24];
  byte abStack_1f8 [216];
  ios_base local_120 [264];
  
  ::std::ofstream::ofstream((ostream *)&local_218,path,_S_out);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,(info->_M_dataplus)._M_p,info->_M_string_length);
  ::std::ofstream::close();
  if ((abStack_1f8[*(long *)(local_218 + -0x18)] & 5) == 0) {
    local_218 = _VTT;
    *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = __invalid_argument;
    ::std::filebuf::~filebuf(local_210);
    ::std::ios_base::~ios_base(local_120);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  piVar1 = __errno_location();
  pcVar2 = strerror(*piVar1);
  ::std::__cxx11::string::string((string *)&local_238,pcVar2,&local_239);
  IOException::IOException(this_00,&local_238);
  __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void QueryProfiler::WriteToFile(const char *path, string &info) const {
	ofstream out(path);
	out << info;
	out.close();
	// throw an IO exception if it fails to write the file
	if (out.fail()) {
		throw IOException(strerror(errno));
	}
}